

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall
ON_NurbsCurve::IsArc(ON_NurbsCurve *this,ON_Plane *plane,ON_Arc *arc,double tolerance)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int local_40;
  int i;
  int degree;
  int knotcount;
  bool bLooseTest;
  double tolerance_local;
  ON_Arc *arc_local;
  ON_Plane *plane_local;
  ON_NurbsCurve *this_local;
  
  bVar1 = 2.3283064365386963e-10 < tolerance;
  iVar2 = KnotCount(this);
  iVar3 = this->m_order + -1;
  if ((((((this->m_dim == 2) || (this->m_dim == 3)) && (this->m_order <= this->m_cv_count)) &&
       ((1 < iVar3 && (this->m_knot != (double *)0x0)))) &&
      ((this->m_cv != (double *)0x0 && ((bVar1 || (this->m_is_rat != 0)))))) &&
     ((bVar1 || (iVar2 % iVar3 == 0)))) {
    if (!bVar1) {
      for (local_40 = 0; local_40 < this->m_cv_count; local_40 = iVar3 + local_40) {
        if ((this->m_knot[local_40] != this->m_knot[local_40 + iVar3 + -1]) ||
           (NAN(this->m_knot[local_40]) || NAN(this->m_knot[local_40 + iVar3 + -1]))) {
          return false;
        }
      }
    }
    uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                      (tolerance);
    if ((uVar4 & 1) != 0) {
      return false;
    }
    bVar1 = ON_Curve::IsArc(&this->super_ON_Curve,plane,arc,tolerance);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
ON_NurbsCurve::IsArc(
      const ON_Plane* plane,
      ON_Arc* arc,
      double tolerance
      ) const
{
  // If changes are made, verify that RR 8497 still works.
  // On 30 April 2003, Mikko changed the strict test to a sloppy
  // test to fix RR 8497.  This change broke other things like 
  // IGES simple entity export tests that require a strict test.
  // So on 6 May 2003 Dale Lear added in the "bLooseTest" check.
  // If the tolerance > ON_ZERO_TOLERANCE a fuzzy fit to arc
  // arc test is performed.  If tolerance <= ON_ZERO_TOLERANCE,
  // a stricter arc test is performed.
  const bool bLooseTest = (tolerance > ON_ZERO_TOLERANCE);
  const int knotcount = KnotCount();
  const int degree = m_order-1;
  if ( (2 == m_dim || 3 == m_dim)
       && m_cv_count >= m_order
       && degree >= 2
       && 0 != m_knot
       && 0 != m_cv
       && (bLooseTest || 0 != m_is_rat)
       )
  {
    if ( bLooseTest || 0 == (knotcount % degree) )
    {

      if ( !bLooseTest )
      {
        for ( int i = 0; i < m_cv_count; i += degree )
        {
          if ( m_knot[i] != m_knot[i+degree-1] )
            return false;
        }
      }

      // 24 July 2012 Dale Lear
      //   You can't be a line and an arc.  This test prevents
      //   creating arcs with small angles and large radii and
      //   prevents sloppy tolerances from classifying a span
      //   as an arc when it makes no sense.
      if ( IsLinear(tolerance) )
        return false;

      if ( ON_Curve::IsArc( plane, arc, tolerance ) )
        return true;
    }
  }

  return false;
}